

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genMaxMinValues_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *varOrder)

{
  pointer puVar1;
  Attribute *pAVar2;
  ulong uVar3;
  CppGenerator *this_00;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_d0);
  for (uVar3 = 0;
      puVar1 = (varOrder->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(varOrder->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pAVar2 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        puVar1[uVar3]);
    this_00 = this;
    offset_abi_cxx11_(&local_150,this,2);
    typeToStr_abi_cxx11_(&local_130,this_00,pAVar2->_type);
    std::operator+(&local_b0,&local_150,&local_130);
    std::operator+(&local_110,&local_b0," min_");
    std::operator+(&local_90,&local_110,&pAVar2->_name);
    std::operator+(&local_70,&local_90,", ");
    std::operator+(&local_f0,&local_70,"max_");
    std::operator+(&local_50,&local_f0,&pAVar2->_name);
    std::operator+(&local_d0,&local_50,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genMaxMinValues(const std::vector<size_t>& varOrder)
{
    std::string returnString = "";
    for (size_t var = 0; var < varOrder.size(); ++var)
    {
        Attribute* attr = _td->getAttribute(varOrder[var]);
        returnString += offset(2)+typeToStr(attr->_type)+" min_"+attr->_name+", "+
            "max_"+attr->_name+";\n";
    }
    return returnString;
}